

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rain-risk.cpp
# Opt level: O3

ostream * operator<<(ostream *os,ship *s)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  int iVar4;
  undefined8 uStack_38;
  
  iVar4 = (s->loc).first;
  iVar1 = (s->loc).second;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Coord (",7);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"), Dir ",7);
  uStack_38 = CONCAT17(s->dir,(undefined7)uStack_38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_38 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Manhattan: ",0xd);
  iVar4 = (s->loc).first;
  iVar1 = (s->loc).second;
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  iVar4 = -iVar1;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4 + iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Waypoint (",0xc);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(s->waypoint).first);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(s->waypoint).second);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const ship& s) {
  auto x = s.loc.first, y = s.loc.second;
  os << "Coord (" << x << "," << y << "), "
        "Dir " << static_cast<char>(s.dir) << ", "
        "Manhattan: " << s.manhattan() << ", "
        "Waypoint (" << s.waypoint.first << "," << s.waypoint.second << ")";
  return os;
}